

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestTexture::setDecode
          (SRGBTestTexture *this,SRGBDecode decoding)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  Functions *gl;
  SRGBDecode decoding_local;
  SRGBTestTexture *this_local;
  long lVar6;
  
  pRVar5 = Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar3 = getGLTargetType(this);
  dVar4 = getHandle(this);
  (*pcVar1)(dVar3,dVar4);
  if (decoding == SRGBDECODE_SKIP_DECODE) {
    pcVar1 = *(code **)(lVar6 + 0x1360);
    dVar3 = getGLTargetType(this);
    (*pcVar1)(dVar3,0x8a48,0x8a4a);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,
                    "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_SKIP_DECODE_EXT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                    ,0x202);
  }
  else if (decoding == SRGBDECODE_DECODE) {
    pcVar1 = *(code **)(lVar6 + 0x1360);
    dVar3 = getGLTargetType(this);
    (*pcVar1)(dVar3,0x8a48,0x8a49);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,
                    "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                    ,0x208);
  }
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar3 = getGLTargetType(this);
  (*pcVar1)(dVar3,0);
  this->m_decoding = decoding;
  return;
}

Assistant:

void SRGBTestTexture::setDecode (const SRGBDecode decoding)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindTexture(this->getGLTargetType(), this->getHandle());

	switch (decoding)
	{
		case SRGBDECODE_SKIP_DECODE:
		{
			gl.texParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_SKIP_DECODE_EXT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_SKIP_DECODE_EXT)");
			break;
		}
		case SRGBDECODE_DECODE:
		{
			gl.texParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT)");
			break;
		}
		case SRGBDECODE_DECODE_DEFAULT:
		{
			// do not use srgb decode options. Set to default
			break;
		}
		default:
			DE_FATAL("Error: Decoding option not recognised");
	}

	gl.bindTexture(this->getGLTargetType(), 0);

	m_decoding = decoding;
}